

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

CURLcode Curl_gmtime(time_t intime,tm *store)

{
  tm *ptVar1;
  tm *tm;
  tm *store_local;
  time_t intime_local;
  
  store_local = (tm *)intime;
  ptVar1 = gmtime_r((time_t *)&store_local,(tm *)store);
  if (ptVar1 == (tm *)0x0) {
    intime_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    intime_local._4_4_ = CURLE_OK;
  }
  return intime_local._4_4_;
}

Assistant:

CURLcode Curl_gmtime(time_t intime, struct tm *store)
{
  const struct tm *tm;
#ifdef HAVE_GMTIME_R
  /* thread-safe version */
  tm = (struct tm *)gmtime_r(&intime, store);
#else
  /* !checksrc! disable BANNEDFUNC 1 */
  tm = gmtime(&intime);
  if(tm)
    *store = *tm; /* copy the pointed struct to the local copy */
#endif

  if(!tm)
    return CURLE_BAD_FUNCTION_ARGUMENT;
  return CURLE_OK;
}